

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::ConsoleReporter::printOpenHeader(ConsoleReporter *this,string *_name)

{
  ostream *poVar1;
  size_t sVar2;
  Colour colourGuard;
  char local_21;
  
  poVar1 = (ostream *)(this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam00000000001b5060 = 0x2d2d2d2d2d2d2d;
    uRam00000000001b5067._0_1_ = '-';
    uRam00000000001b5067._1_1_ = '-';
    uRam00000000001b5067._2_1_ = '-';
    uRam00000000001b5067._3_1_ = '-';
    uRam00000000001b5067._4_1_ = '-';
    uRam00000000001b5067._5_1_ = '-';
    uRam00000000001b5067._6_1_ = '-';
    uRam00000000001b5067._7_1_ = '-';
    DAT_001b5050 = '-';
    DAT_001b5050_1._0_1_ = '-';
    DAT_001b5050_1._1_1_ = '-';
    DAT_001b5050_1._2_1_ = '-';
    DAT_001b5050_1._3_1_ = '-';
    DAT_001b5050_1._4_1_ = '-';
    DAT_001b5050_1._5_1_ = '-';
    DAT_001b5050_1._6_1_ = '-';
    uRam00000000001b5058 = 0x2d2d2d2d2d2d2d;
    DAT_001b505f = 0x2d;
    DAT_001b5040 = '-';
    DAT_001b5040_1._0_1_ = '-';
    DAT_001b5040_1._1_1_ = '-';
    DAT_001b5040_1._2_1_ = '-';
    DAT_001b5040_1._3_1_ = '-';
    DAT_001b5040_1._4_1_ = '-';
    DAT_001b5040_1._5_1_ = '-';
    DAT_001b5040_1._6_1_ = '-';
    uRam00000000001b5048._0_1_ = '-';
    uRam00000000001b5048._1_1_ = '-';
    uRam00000000001b5048._2_1_ = '-';
    uRam00000000001b5048._3_1_ = '-';
    uRam00000000001b5048._4_1_ = '-';
    uRam00000000001b5048._5_1_ = '-';
    uRam00000000001b5048._6_1_ = '-';
    uRam00000000001b5048._7_1_ = '-';
    DAT_001b5030 = '-';
    DAT_001b5030_1._0_1_ = '-';
    DAT_001b5030_1._1_1_ = '-';
    DAT_001b5030_1._2_1_ = '-';
    DAT_001b5030_1._3_1_ = '-';
    DAT_001b5030_1._4_1_ = '-';
    DAT_001b5030_1._5_1_ = '-';
    DAT_001b5030_1._6_1_ = '-';
    uRam00000000001b5038._0_1_ = '-';
    uRam00000000001b5038._1_1_ = '-';
    uRam00000000001b5038._2_1_ = '-';
    uRam00000000001b5038._3_1_ = '-';
    uRam00000000001b5038._4_1_ = '-';
    uRam00000000001b5038._5_1_ = '-';
    uRam00000000001b5038._6_1_ = '-';
    uRam00000000001b5038._7_1_ = '-';
    getLineOfChars<(char)45>()::line = '-';
    getLineOfChars<(char)45>()::line_1._0_1_ = '-';
    getLineOfChars<(char)45>()::line_1._1_1_ = '-';
    getLineOfChars<(char)45>()::line_1._2_1_ = '-';
    getLineOfChars<(char)45>()::line_1._3_1_ = '-';
    getLineOfChars<(char)45>()::line_1._4_1_ = '-';
    getLineOfChars<(char)45>()::line_1._5_1_ = '-';
    getLineOfChars<(char)45>()::line_1._6_1_ = '-';
    uRam00000000001b5028._0_1_ = '-';
    uRam00000000001b5028._1_1_ = '-';
    uRam00000000001b5028._2_1_ = '-';
    uRam00000000001b5028._3_1_ = '-';
    uRam00000000001b5028._4_1_ = '-';
    uRam00000000001b5028._5_1_ = '-';
    uRam00000000001b5028._6_1_ = '-';
    uRam00000000001b5028._7_1_ = '-';
    DAT_001b506f = 0;
  }
  sVar2 = strlen(&getLineOfChars<(char)45>()::line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&getLineOfChars<(char)45>()::line,sVar2)
  ;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_21,1);
  Colour::use(Headers);
  printHeaderString(this,_name,0);
  Colour::use(None);
  return;
}

Assistant:

void ConsoleReporter::printOpenHeader(std::string const& _name) {
    stream << getLineOfChars<'-'>() << '\n';
    {
        Colour colourGuard(Colour::Headers);
        printHeaderString(_name);
    }
}